

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfGenericOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::GenericOutputFile::writeMagicNumberAndVersionField
          (GenericOutputFile *this,OStream *os,Header *header)

{
  uint v;
  bool bVar1;
  string *name;
  uint uVar2;
  
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,0x1312f76);
  bVar1 = Header::hasType(header);
  if (bVar1) {
    name = Header::type_abi_cxx11_(header);
    bVar1 = isDeepData(name);
    uVar2 = 0x802;
    if (bVar1) goto LAB_001796f1;
  }
  bVar1 = Header::hasTileDescription(header);
  uVar2 = (uint)bVar1 << 9 | 2;
LAB_001796f1:
  bVar1 = usesLongNames(header);
  v = uVar2 | 0x400;
  if (!bVar1) {
    v = uVar2;
  }
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,v);
  return;
}

Assistant:

void
GenericOutputFile::writeMagicNumberAndVersionField (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os, const Header& header)
{
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, MAGIC);

    int version = EXR_VERSION;

    if (header.hasType () && isDeepData (header.type ()))
    {
        version |= NON_IMAGE_FLAG;
    }
    else
    {
        // (TODO) we may want to check something else in function signature
        // instead of hasTileDescription()?
        if (header.hasTileDescription ()) version |= TILED_FLAG;
    }

    if (usesLongNames (header)) version |= LONG_NAMES_FLAG;

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, version);
}